

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

bool __thiscall
google::protobuf::
Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
InnerMap::
iterator_base<const_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
::revalidate_if_necessary
          (iterator_base<const_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
           *this,TreeIterator *it)

{
  void **ppvVar1;
  void *pvVar2;
  LogMessage *other;
  Node *l;
  Node *pNVar3;
  Node *k;
  InnerMap *this_00;
  ulong uVar4;
  bool bVar5;
  LogFinisher local_51;
  iterator_base<const_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
  i;
  
  k = this->node_;
  this_00 = this->m_;
  if (this_00 == (InnerMap *)0x0 || k == (Node *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&i,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x1cb);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&i,"CHECK failed: node_ != NULL && m_ != NULL: ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage((LogMessage *)&i);
    k = this->node_;
    this_00 = this->m_;
  }
  uVar4 = this_00->num_buckets_ - 1 & this->bucket_index_;
  this->bucket_index_ = uVar4;
  pNVar3 = (Node *)this_00->table_[uVar4];
  bVar5 = true;
  if (pNVar3 != k) {
    if ((pNVar3 != (Node *)0x0) && (pNVar3 != (Node *)this_00->table_[uVar4 ^ 1])) {
      do {
        pNVar3 = pNVar3->next;
        if (pNVar3 == k) break;
      } while (pNVar3 != (Node *)0x0);
      if (pNVar3 != (Node *)0x0) {
        return true;
      }
    }
    InnerMap::find(&i,this_00,(long *)k,it);
    this->bucket_index_ = i.bucket_index_;
    ppvVar1 = this->m_->table_;
    pvVar2 = ppvVar1[i.bucket_index_];
    if (pvVar2 == (void *)0x0) {
      bVar5 = true;
    }
    else {
      bVar5 = pvVar2 != ppvVar1[i.bucket_index_ ^ 1];
    }
  }
  return bVar5;
}

Assistant:

bool revalidate_if_necessary(TreeIterator* it) {
        GOOGLE_DCHECK(node_ != NULL && m_ != NULL);
        // Force bucket_index_ to be in range.
        bucket_index_ &= (m_->num_buckets_ - 1);
        // Common case: the bucket we think is relevant points to node_.
        if (m_->table_[bucket_index_] == static_cast<void*>(node_))
          return true;
        // Less common: the bucket is a linked list with node_ somewhere in it,
        // but not at the head.
        if (m_->TableEntryIsNonEmptyList(bucket_index_)) {
          Node* l = static_cast<Node*>(m_->table_[bucket_index_]);
          while ((l = l->next) != NULL) {
            if (l == node_) {
              return true;
            }
          }
        }
        // Well, bucket_index_ still might be correct, but probably
        // not.  Revalidate just to be sure.  This case is rare enough that we
        // don't worry about potential optimizations, such as having a custom
        // find-like method that compares Node* instead of const Key&.
        iterator_base i(m_->find(*KeyPtrFromNodePtr(node_), it));
        bucket_index_ = i.bucket_index_;
        return m_->TableEntryIsList(bucket_index_);
      }